

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall ritobin::io::impl_text_read::TextReader::read_name(TextReader *this,string *value)

{
  byte bVar1;
  size_t sVar2;
  string_view word;
  allocator<char> local_41;
  string_view local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_40 = read_word(this);
  if ((local_40._M_len != 0) && ((byte)((*local_40._M_str & 0xdfU) + 0xbf) < 0x1a)) {
    sVar2 = 0;
    do {
      if (local_40._M_len == sVar2) {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_30,&local_40,&local_41);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        return true;
      }
      bVar1 = local_40._M_str[sVar2];
      sVar2 = sVar2 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  }
  return false;
}

Assistant:

bool read_name(std::string& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (!in_range<'a', 'z'>(word[0]) && !in_range<'A', 'Z'>(word[0])) {
                return false;
            }
            for (auto const& c : word) {
                if (c != '_'
                    && !in_range<'a', 'z'>(c)
                    && !in_range<'A', 'Z'>(c)
                    && !in_range<'0', '9'>(c)) {
                    return false;
                }
            }
            value = { std::string(word) };
            return true;
        }